

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::utp_stream::
async_write_some<boost::asio::const_buffers_1,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>>
          (utp_stream *this,const_buffers_1 *buffers,
          write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
          *handler)

{
  io_context *piVar1;
  size_t len;
  initiate_post local_b9;
  _Bind_result<void,_boost::asio::detail::write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>_(boost::system::error_code,_unsigned_long)>
  local_b8;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    boost::asio::detail::
    write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
    ::write_op(&local_b8._M_f,handler);
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x6b;
    boost::asio::io_context::initiate_post::operator()
              (&local_b9,
               (_Bind_result<void,_boost::asio::detail::write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                *)&local_b8,piVar1);
  }
  else if ((this->m_write_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
    len = (buffers->super_const_buffer).size_;
    if (len != 0) {
      add_write_buffer(this,(buffers->super_const_buffer).data_,len);
      if ((buffers->super_const_buffer).size_ != 0) {
        std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_write_handler,handler);
        issue_write(this);
        return;
      }
    }
    piVar1 = this->m_io_service;
    boost::asio::detail::
    write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
    ::write_op(&local_b8._M_f,handler);
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.failed_ = false;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    boost::asio::io_context::initiate_post::operator()(&local_b9,&local_b8,piVar1);
  }
  else {
    piVar1 = this->m_io_service;
    boost::asio::detail::
    write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
    ::write_op(&local_b8._M_f,handler);
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_b8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x5f;
    boost::asio::io_context::initiate_post::operator()
              (&local_b9,
               (_Bind_result<void,_boost::asio::detail::write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                *)&local_b8,piVar1);
  }
  if (local_b8._M_f.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
      .
      super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
      ._M_head_impl.
      super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8._M_f.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
               .
               super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
               .
               super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
               .
               super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
               ._M_head_impl.
               super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
#if BOOST_VERSION >= 106600
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
#else
		for (typename Const_Buffers::const_iterator i = buffers.begin()
			, end(buffers.end()); i != end; ++i)
#endif
		{
			if (buffer_size(*i) == 0) continue;
			using boost::asio::buffer_cast;
			using boost::asio::buffer_size;
			add_write_buffer(buffer_cast<void const*>(*i), buffer_size(*i));
			bytes_added += buffer_size(*i);
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			m_io_service.post(std::bind<void>(handler, error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = handler;
		issue_write();
	}